

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

Id_t __thiscall Potassco::AspifTextOutput::Data::addCondition(Data *this,LitSpan *cond)

{
  bool bVar1;
  undefined4 uVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *this_00;
  size_t sVar4;
  const_iterator in_RSI;
  long in_RDI;
  Id_t id;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    in_stack_ffffffffffffffe4 = 0;
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffa0,(value_type_conflict2 *)in_stack_ffffffffffffff98);
  }
  bVar1 = empty<int>((Span<int> *)in_RSI._M_current);
  if (bVar1) {
    local_4 = 0;
  }
  else {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80));
    local_4 = (Id_t)sVar3;
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x80);
    sVar4 = size<int>((Span<int> *)in_RSI._M_current);
    uVar2 = (undefined4)sVar4;
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type_conflict2 *)in_stack_ffffffffffffff98);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff98);
    begin<int>((Span<int> *)in_RSI._M_current);
    end<int>((Span<int> *)0x113c16);
    std::vector<int,std::allocator<int>>::insert<int_const*,void>
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffe4,local_4),
               in_RSI,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  }
  return local_4;
}

Assistant:

Id_t addCondition(const LitSpan& cond) {
		if (conditions.empty()) { conditions.push_back(0); }
		if (empty(cond)) { return 0; }
		Id_t id = static_cast<Id_t>(conditions.size());
		conditions.push_back(static_cast<Lit_t>(size(cond)));
		conditions.insert(conditions.end(), begin(cond), end(cond));
		return id;
	}